

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subcommand.c
# Opt level: O1

REF_STATUS translate(REF_MPI ref_mpi,int argc,char **argv)

{
  int iVar1;
  REF_NODE pRVar2;
  REF_DBL *pRVar3;
  REF_CELL ref_cell;
  REF_GRID_conflict twod_grid;
  uint uVar4;
  uint uVar5;
  int iVar6;
  REF_STATUS RVar7;
  long lVar8;
  long *plVar9;
  size_t sVar10;
  REF_CELL *ppRVar11;
  undefined8 uVar12;
  undefined8 extraout_RDX;
  ulong uVar13;
  long lVar14;
  char *pcVar15;
  ulong uVar16;
  char *pcVar17;
  long lVar18;
  bool bVar19;
  char cVar20;
  REF_GRID pRVar21;
  double dVar22;
  REF_NODE pRVar23;
  REF_INT pos;
  REF_GRID_conflict ref_grid;
  REF_DBL deviation;
  REF_DBL total_deviation;
  char *endptr;
  int local_f8;
  int local_f4;
  REF_GRID_conflict local_f0;
  REF_GRID local_e8;
  char *local_e0;
  double local_d8;
  REF_NODE local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  undefined1 local_b0 [8];
  char *local_a8 [15];
  
  local_f0 = (REF_GRID)0x0;
  local_f4 = argc;
  if (argc < 4) goto LAB_0011db11;
  pcVar15 = argv[2];
  pcVar17 = argv[3];
  ref_mpi_stopwatch_start(ref_mpi);
  if (ref_mpi->n < 2) {
    if (ref_mpi->id == 0) {
      printf("import %s\n",pcVar15);
    }
    uVar4 = ref_import_by_extension(&local_f0,ref_mpi,pcVar15);
    if (uVar4 != 0) {
      pcVar15 = "import";
      uVar12 = 0x106d;
      goto LAB_0011dbe3;
    }
    pcVar15 = "import";
  }
  else {
    if (ref_mpi->id == 0) {
      printf("part %s\n",pcVar15);
    }
    uVar4 = ref_part_by_extension(&local_f0,ref_mpi,pcVar15);
    if (uVar4 != 0) {
      pcVar15 = "part";
      uVar12 = 0x1069;
      goto LAB_0011dbe3;
    }
    pcVar15 = "part";
  }
  ref_mpi_stopwatch_stop(ref_mpi,pcVar15);
  if (ref_mpi->id == 0) {
    printf("  read %ld vertices\n",local_f0->node->old_n_global);
  }
  uVar5 = ref_args_find(local_f4,argv,"--scale",&local_f8);
  uVar4 = 0;
  if ((uVar5 != 0) && (uVar5 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0x1074,"translate",(ulong)uVar5,"arg search");
    uVar4 = uVar5;
  }
  if ((uVar5 != 5) && (uVar5 != 0)) {
    return uVar4;
  }
  lVar8 = (long)local_f8;
  if (lVar8 != -1) {
    if (local_f8 + 1 < local_f4) {
      pRVar2 = local_f0->node;
      local_f8 = local_f8 + 1;
      pRVar21 = (REF_GRID)strtod(argv[lVar8 + 1],local_a8);
      if (argv[local_f8] == local_a8[0]) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x1080,"translate","parse scale");
        iVar6 = 1;
        uVar4 = 1;
      }
      else {
        if (ref_mpi->id == 0) {
          local_e8 = pRVar21;
          printf("--scale %e\n");
          pRVar21 = local_e8;
        }
        iVar6 = pRVar2->max;
        if (0 < (long)iVar6) {
          plVar9 = pRVar2->global;
          lVar8 = 0;
          do {
            if (-1 < *plVar9) {
              pRVar3 = pRVar2->real;
              *(double *)((long)pRVar3 + lVar8) =
                   *(double *)((long)pRVar3 + lVar8) * (double)pRVar21;
              *(double *)((long)pRVar3 + lVar8 + 8) =
                   *(double *)((long)pRVar3 + lVar8 + 8) * (double)pRVar21;
              *(double *)((long)pRVar3 + lVar8 + 0x10) =
                   *(double *)((long)pRVar3 + lVar8 + 0x10) * (double)pRVar21;
            }
            lVar8 = lVar8 + 0x78;
            plVar9 = plVar9 + 1;
          } while ((long)iVar6 * 0x78 - lVar8 != 0);
        }
        iVar6 = 0;
      }
    }
    else {
      iVar6 = 2;
      if (ref_mpi->id == 0) {
        puts("--scale missing scale");
      }
    }
    if (iVar6 == 2) goto LAB_0011db11;
    if (iVar6 != 0) {
      return uVar4;
    }
  }
  uVar5 = ref_args_find(local_f4,argv,"--shift",&local_f8);
  if ((uVar5 != 0) && (uVar5 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0x1089,"translate",(ulong)uVar5,"arg search");
    uVar4 = uVar5;
  }
  if ((uVar5 != 5) && (uVar5 != 0)) {
    return uVar4;
  }
  lVar8 = (long)local_f8;
  if (lVar8 != -1) {
    if (local_f8 + 3 < local_f4) {
      pRVar2 = local_f0->node;
      local_f8 = local_f8 + 1;
      pRVar21 = (REF_GRID)strtod(argv[lVar8 + 1],local_a8);
      lVar8 = (long)local_f8;
      if (argv[lVar8] == local_a8[0]) {
        pcVar15 = "parse dx";
        uVar12 = 0x1095;
      }
      else {
        local_f8 = local_f8 + 1;
        local_e8 = pRVar21;
        dVar22 = strtod(argv[lVar8 + 1],local_a8);
        lVar8 = (long)local_f8;
        if (argv[lVar8] == local_a8[0]) {
          pcVar15 = "parse dy";
          uVar12 = 0x1098;
        }
        else {
          local_f8 = local_f8 + 1;
          local_d8 = dVar22;
          pRVar23 = (REF_NODE)strtod(argv[lVar8 + 1],local_a8);
          if (argv[local_f8] != local_a8[0]) {
            if (ref_mpi->id == 0) {
              local_d0 = pRVar23;
              printf("--shift %e %e %e\n",local_e8,local_d8,pRVar23);
              pRVar23 = local_d0;
            }
            iVar6 = pRVar2->max;
            if (0 < (long)iVar6) {
              plVar9 = pRVar2->global;
              lVar8 = 0;
              do {
                if (-1 < *plVar9) {
                  pRVar3 = pRVar2->real;
                  *(double *)((long)pRVar3 + lVar8) =
                       *(double *)((long)pRVar3 + lVar8) + (double)local_e8;
                  *(double *)((long)pRVar3 + lVar8 + 8) =
                       *(double *)((long)pRVar3 + lVar8 + 8) + local_d8;
                  *(double *)((long)pRVar3 + lVar8 + 0x10) =
                       *(double *)((long)pRVar3 + lVar8 + 0x10) + (double)pRVar23;
                }
                lVar8 = lVar8 + 0x78;
                plVar9 = plVar9 + 1;
              } while ((long)iVar6 * 0x78 - lVar8 != 0);
            }
            iVar6 = 0;
            goto LAB_0011e00c;
          }
          pcVar15 = "parse dz";
          uVar12 = 0x109b;
        }
      }
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             uVar12,"translate",pcVar15);
      iVar6 = 1;
      uVar4 = 1;
    }
    else {
      iVar6 = 2;
      if (ref_mpi->id == 0) {
        puts("--shift missing dx dy dz");
      }
    }
LAB_0011e00c:
    if (iVar6 == 2) goto LAB_0011db11;
    if (iVar6 != 0) {
      return uVar4;
    }
  }
  uVar5 = ref_args_find(local_f4,argv,"--rotatey",&local_f8);
  if ((uVar5 != 0) && (uVar5 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0x10a5,"translate",(ulong)uVar5,"arg search");
    uVar4 = uVar5;
  }
  if ((uVar5 != 5) && (uVar5 != 0)) {
    return uVar4;
  }
  lVar8 = (long)local_f8;
  if (lVar8 != -1) {
    if (local_f8 + 1 < local_f4) {
      pRVar2 = local_f0->node;
      local_f8 = local_f8 + 1;
      dVar22 = strtod(argv[lVar8 + 1],local_a8);
      if (argv[local_f8] == local_a8[0]) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x10b1,"translate","parse degree");
        iVar6 = 1;
        uVar4 = 1;
      }
      else {
        local_e8 = (REF_GRID)((dVar22 / 180.0) * 3.14159265358979);
        local_e0 = pcVar17;
        if (ref_mpi->id == 0) {
          printf("--rotatex %f degree %f radian\n",dVar22,local_e8);
        }
        if (0 < pRVar2->max) {
          lVar18 = 0;
          lVar8 = 0;
          do {
            if (-1 < pRVar2->global[lVar8]) {
              pRVar3 = pRVar2->real;
              local_d8 = *(double *)((long)pRVar3 + lVar18);
              local_c0 = *(double *)((long)pRVar3 + lVar18 + 8);
              local_d0 = *(REF_NODE *)((long)pRVar3 + lVar18 + 0x10);
              local_b8 = cos((double)local_e8);
              dVar22 = sin((double)local_e8);
              pRVar3 = pRVar2->real;
              *(double *)((long)pRVar3 + lVar18) = local_b8 * local_d8 - dVar22 * (double)local_d0;
              *(double *)((long)pRVar3 + lVar18 + 8) = local_c0;
              local_c0 = sin((double)local_e8);
              dVar22 = cos((double)local_e8);
              *(double *)((long)pRVar2->real + lVar18 + 0x10) =
                   local_c0 * local_d8 + dVar22 * (double)local_d0;
            }
            lVar8 = lVar8 + 1;
            lVar18 = lVar18 + 0x78;
          } while (lVar8 < pRVar2->max);
        }
        iVar6 = 0;
        pcVar17 = local_e0;
      }
    }
    else {
      iVar6 = 2;
      if (ref_mpi->id == 0) {
        puts("--rotatey missing degrees");
      }
    }
    if (iVar6 == 2) goto LAB_0011db11;
    if (iVar6 != 0) {
      return uVar4;
    }
  }
  uVar5 = ref_args_find(local_f4,argv,"--surface",&local_f8);
  if ((uVar5 != 0) && (uVar5 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0x10c1,"translate",(ulong)uVar5,"arg search");
    uVar4 = uVar5;
  }
  if ((uVar5 != 5) && (uVar5 != 0)) {
    return uVar4;
  }
  local_d8 = (double)CONCAT44(local_d8._4_4_,local_f8);
  if (local_f8 != -1) {
    local_e0 = pcVar17;
    if (ref_mpi->id == 0) {
      puts("  --surface deleting 3D cells");
    }
    ppRVar11 = local_f0->cell + 8;
    uVar16 = 8;
    uVar13 = 0;
    lVar8 = 0x50;
    do {
      local_e8 = (REF_GRID)CONCAT44(local_e8._4_4_,(int)uVar13);
      uVar5 = ref_cell_free(*ppRVar11);
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x10c8,"translate",(ulong)uVar5,"free cell");
        uVar4 = uVar5;
LAB_0011e3aa:
        uVar13 = (ulong)local_e8 & 0xffffffff;
        break;
      }
      uVar5 = ref_cell_create((REF_CELL *)((long)local_f0->cell + lVar8 + -0x10),
                              (REF_CELL_TYPE)uVar16);
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x10cb,"translate",(ulong)uVar5,"empty cell create");
        uVar4 = uVar5;
        goto LAB_0011e3aa;
      }
      ppRVar11 = (REF_CELL *)((long)local_f0->cell + lVar8 + -8);
      bVar19 = 0xe < uVar16;
      uVar16 = uVar16 + 1;
      uVar13 = CONCAT71((int7)((ulong)extraout_RDX >> 8),bVar19);
      lVar8 = lVar8 + 8;
    } while (uVar16 != 0x10);
    pcVar17 = local_e0;
    if ((uVar13 & 1) == 0) {
      return uVar4;
    }
  }
  uVar5 = ref_args_find(local_f4,argv,"--orient",&local_f8);
  if ((uVar5 != 0) && (uVar5 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0x10d0,"translate",(ulong)uVar5,"arg search");
    uVar4 = uVar5;
  }
  if ((uVar5 != 5) && (uVar5 != 0)) {
    return uVar4;
  }
  if (local_f8 != -1) {
    if (ref_mpi->id == 0) {
      puts("  --orient twod in place");
    }
    uVar5 = ref_grid_orient_twod(local_f0);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0x10d3,"translate",(ulong)uVar5,"orient twod");
      return uVar5;
    }
  }
  uVar5 = ref_args_find(local_f4,argv,"--shard",&local_f8);
  if ((uVar5 != 0) && (uVar5 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0x10d6,"translate",(ulong)uVar5,"arg search");
    uVar4 = uVar5;
  }
  if ((uVar5 != 5) && (uVar5 != 0)) {
    return uVar4;
  }
  if (local_f8 != -1) {
    if (ref_mpi->id == 0) {
      puts("  --shard in place");
    }
    uVar5 = ref_shard_in_place(local_f0);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0x10d9,"translate",(ulong)uVar5,"shard to simplex");
      return uVar5;
    }
  }
  uVar5 = ref_args_find(local_f4,argv,"--blockhead",&local_f8);
  if ((uVar5 != 0) && (uVar5 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0x10dd,"translate",(ulong)uVar5,"arg search");
    uVar4 = uVar5;
  }
  if ((uVar5 != 5) && (uVar5 != 0)) {
    return uVar4;
  }
  if (local_f8 != -1) {
    if (ref_mpi->id == 0) {
      puts("  --blockhead in place");
    }
    uVar5 = ref_subdiv_to_hex(local_f0);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0x10e0,"translate",(ulong)uVar5,"shard to simplex");
      return uVar5;
    }
  }
  uVar5 = ref_args_find(local_f4,argv,"--enrich2",&local_f8);
  if ((uVar5 != 0) && (uVar5 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0x10e4,"translate",(ulong)uVar5,"arg search");
    uVar4 = uVar5;
  }
  if ((uVar5 != 5) && (uVar5 != 0)) {
    return uVar4;
  }
  if (local_f8 != -1) {
    if (ref_mpi->id == 0) {
      puts("  --enrich2");
    }
    uVar5 = ref_geom_enrich2(local_f0);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0x10e7,"translate",(ulong)uVar5,"enrich to q2");
      return uVar5;
    }
  }
  uVar5 = ref_args_find(local_f4,argv,"--extrude",&local_f8);
  if ((uVar5 != 0) && (uVar5 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0x10eb,"translate",(ulong)uVar5,"arg search");
    uVar4 = uVar5;
  }
  iVar6 = local_f8;
  if ((uVar5 != 5) && (uVar5 != 0)) {
    return uVar4;
  }
  bVar19 = local_f8 != -1;
  local_e0 = pcVar17;
  uVar5 = ref_args_find(local_f4,argv,"--planes",&local_f8);
  if ((uVar5 != 0) && (uVar5 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0x10f0,"translate",(ulong)uVar5,"arg search");
    uVar4 = uVar5;
  }
  if ((uVar5 != 5) && (uVar5 != 0)) {
    return uVar4;
  }
  if ((long)local_f8 == -1 || iVar6 == -1) {
    if (local_f8 == -1) {
      sVar10 = strlen(local_e0);
      if (((5 < sVar10 && local_f0->twod != 0) &&
          (iVar6 = strncmp(local_e0 + (sVar10 - 6),".ugrid",6), iVar6 == 0)) &&
         (bVar19 = true, ref_mpi->id == 0)) {
        puts("  --extrude implicitly added to ugrid output of 2D input.");
      }
    }
    else {
      if (local_f8 + 1 < local_f4) {
        local_e8 = local_f0;
        uVar5 = atoi(argv[(long)local_f8 + 1]);
        if ((int)uVar5 < 2) {
          cVar20 = '\x02';
          if (ref_mpi->id == 0) {
            printf("--planes %d must be 2 or more\n",(ulong)uVar5);
          }
        }
        else {
          if (ref_mpi->id == 0) {
            printf("extrude %d layers of prisms\n",(ulong)uVar5);
          }
          uVar5 = ref_grid_extrude_twod(&local_f0,local_e8,uVar5);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0x1104,"translate",(ulong)uVar5,"extrude");
            uVar4 = uVar5;
          }
          cVar20 = '\x01';
          if (uVar5 == 0) {
            uVar5 = ref_grid_free(local_e8);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x1105,"translate",(ulong)uVar5,"free");
              uVar4 = uVar5;
            }
            cVar20 = uVar5 != 0;
          }
        }
      }
      else {
        cVar20 = '\x02';
        if (ref_mpi->id == 0) {
          puts("--planes missing N");
        }
      }
      if (cVar20 != '\0') {
        if (cVar20 != '\x02') {
          return uVar4;
        }
        goto LAB_0011db11;
      }
    }
    twod_grid = local_f0;
    if (bVar19) {
      if (ref_mpi->id == 0) {
        puts("extrude prisms");
      }
      uVar5 = ref_grid_extrude_twod(&local_f0,twod_grid,2);
      if (uVar5 == 0) {
        uVar5 = ref_grid_free(twod_grid);
        bVar19 = uVar5 == 0;
        if (!bVar19) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x1114,"translate",(ulong)uVar5,"free");
          uVar4 = uVar5;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x1113,"translate",(ulong)uVar5,"extrude");
        bVar19 = false;
        uVar4 = uVar5;
      }
      if (!bVar19) {
        return uVar4;
      }
    }
    uVar5 = ref_args_find(local_f4,argv,"--zero-y-face",&local_f8);
    if ((uVar5 != 0) && (uVar5 != 5)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0x1118,"translate",(ulong)uVar5,"arg search");
      uVar4 = uVar5;
    }
    if ((uVar5 != 5) && (uVar5 != 0)) {
      return uVar4;
    }
    if ((long)local_f8 != -1) {
      if (local_f8 + 1 < local_f4) {
        local_d0 = local_f0->node;
        iVar6 = atoi(argv[(long)local_f8 + 1]);
        local_e8 = (REF_GRID)CONCAT44(local_e8._4_4_,iVar6);
        if (ref_mpi->id == 0) {
          printf("zero y of face %d\n",iVar6);
        }
        local_c8 = 0.0;
        ppRVar11 = local_f0->cell + 3;
        lVar8 = 3;
        do {
          ref_cell = *ppRVar11;
          if (0 < ref_cell->max) {
            iVar6 = 0;
            do {
              RVar7 = ref_cell_nodes(ref_cell,iVar6,(REF_INT *)local_a8);
              if (RVar7 == 0) {
                iVar1 = ref_cell->node_per;
                if (((int)local_e8 == *(int *)((long)local_a8 + (long)iVar1 * 4)) && (0 < iVar1)) {
                  pRVar3 = local_d0->real;
                  lVar18 = 0;
                  do {
                    lVar14 = (long)*(int *)((long)local_a8 + lVar18 * 4);
                    dVar22 = pRVar3[lVar14 * 0xf + 1];
                    if (dVar22 <= -dVar22) {
                      dVar22 = -dVar22;
                    }
                    if (local_c8 <= dVar22) {
                      local_c8 = dVar22;
                    }
                    pRVar3[lVar14 * 0xf + 1] = 0.0;
                    lVar18 = lVar18 + 1;
                  } while (iVar1 != lVar18);
                }
              }
              iVar6 = iVar6 + 1;
            } while (iVar6 < ref_cell->max);
          }
          ppRVar11 = local_f0->cell + lVar8 + 1;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 8);
        uVar5 = ref_mpi_max(ref_mpi,&local_c8,local_b0,3);
        if (uVar5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x1131,"translate",(ulong)uVar5,"mpi max");
          uVar4 = uVar5;
        }
        iVar6 = 1;
        if ((uVar5 == 0) && (iVar6 = 0, ref_mpi->id == 0)) {
          printf("max deviation %e\n",local_c8);
        }
      }
      else {
        iVar6 = 2;
        if (ref_mpi->id == 0) {
          puts("--zero-y-face missing faceid");
        }
      }
      if (iVar6 == 2) goto LAB_0011db11;
      if (iVar6 != 0) {
        return uVar4;
      }
    }
    uVar5 = ref_args_find(local_f4,argv,"--axi",&local_f8);
    if ((uVar5 != 0) && (uVar5 != 5)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0x1135,"translate",(ulong)uVar5,"arg search");
      uVar4 = uVar5;
    }
    if ((uVar5 != 5) && (uVar5 != 0)) {
      return uVar4;
    }
    if (local_f8 != -1) {
      if (ref_mpi->id == 0) {
        puts("--axi creates wedge about y=z=0 axis");
      }
      uVar4 = ref_axi_wedge(local_f0);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x1138,"translate",(ulong)uVar4,"wedge");
        return uVar4;
      }
    }
    iVar6 = ref_mpi->id;
    if (ref_mpi->n < 2) {
      if (local_d8._0_4_ == -1) {
        if (iVar6 == 0) {
          printf("export %ld nodes to %s\n",local_f0->node->old_n_global,local_e0);
        }
      }
      else if (iVar6 == 0) {
        printf("export surface to %s\n",local_e0);
      }
      uVar4 = ref_export_by_extension(local_f0,local_e0);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x114d,"translate",(ulong)uVar4,"export");
        return uVar4;
      }
      pcVar15 = "export";
    }
    else {
      if (local_d8._0_4_ == -1) {
        if (iVar6 == 0) {
          printf("gather %ld nodes to %s\n",local_f0->node->old_n_global,local_e0);
        }
      }
      else if (iVar6 == 0) {
        printf("gather surface to %s\n",local_e0);
      }
      uVar4 = ref_gather_by_extension(local_f0,local_e0);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x1143,"translate",(ulong)uVar4,"gather");
        return uVar4;
      }
      pcVar15 = "gather";
    }
    ref_mpi_stopwatch_stop(ref_mpi,pcVar15);
    uVar4 = ref_grid_free(local_f0);
    if (uVar4 == 0) {
      return 0;
    }
    pcVar15 = "free grid";
    uVar12 = 0x1151;
LAB_0011dbe3:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           uVar12,"translate",(ulong)uVar4,pcVar15);
    return uVar4;
  }
  if (ref_mpi->id == 0) {
    puts("--extrude and --planes exclusive");
  }
LAB_0011db11:
  if (ref_mpi->id != 0) {
    return 1;
  }
  translate_help(*argv);
  return 1;
}

Assistant:

static REF_STATUS translate(REF_MPI ref_mpi, int argc, char *argv[]) {
  char *out_file;
  char *in_file;
  REF_GRID ref_grid = NULL;
  REF_INT pos;
  REF_BOOL extrude = REF_FALSE;
  REF_BOOL surface_only = REF_FALSE;
  size_t end_of_string;

  if (argc < 4) goto shutdown;
  in_file = argv[2];
  out_file = argv[3];

  ref_mpi_stopwatch_start(ref_mpi);

  if (ref_mpi_para(ref_mpi)) {
    if (ref_mpi_once(ref_mpi)) printf("part %s\n", in_file);
    RSS(ref_part_by_extension(&ref_grid, ref_mpi, in_file), "part");
    ref_mpi_stopwatch_stop(ref_mpi, "part");
  } else {
    if (ref_mpi_once(ref_mpi)) printf("import %s\n", in_file);
    RSS(ref_import_by_extension(&ref_grid, ref_mpi, in_file), "import");
    ref_mpi_stopwatch_stop(ref_mpi, "import");
  }
  if (ref_mpi_once(ref_mpi))
    printf("  read " REF_GLOB_FMT " vertices\n",
           ref_node_n_global(ref_grid_node(ref_grid)));

  RXS(ref_args_find(argc, argv, "--scale", &pos), REF_NOT_FOUND, "arg search");
  if (REF_EMPTY != pos) {
    char *endptr;
    REF_DBL scale;
    REF_NODE ref_node = ref_grid_node(ref_grid);
    REF_INT node;
    if (pos + 1 >= argc) {
      if (ref_mpi_once(ref_mpi)) printf("--scale missing scale\n");
      goto shutdown;
    }
    pos++;
    scale = strtod(argv[pos], &endptr);
    RAS(argv[pos] != endptr, "parse scale");
    if (ref_mpi_once(ref_mpi)) printf("--scale %e\n", scale);
    each_ref_node_valid_node(ref_node, node) {
      ref_node_xyz(ref_node, 0, node) *= scale;
      ref_node_xyz(ref_node, 1, node) *= scale;
      ref_node_xyz(ref_node, 2, node) *= scale;
    }
  }

  RXS(ref_args_find(argc, argv, "--shift", &pos), REF_NOT_FOUND, "arg search");
  if (REF_EMPTY != pos) {
    char *endptr;
    REF_DBL dx, dy, dz;
    REF_NODE ref_node = ref_grid_node(ref_grid);
    REF_INT node;
    if (pos + 3 >= argc) {
      if (ref_mpi_once(ref_mpi)) printf("--shift missing dx dy dz\n");
      goto shutdown;
    }
    pos++;
    dx = strtod(argv[pos], &endptr);
    RAS(argv[pos] != endptr, "parse dx");
    pos++;
    dy = strtod(argv[pos], &endptr);
    RAS(argv[pos] != endptr, "parse dy");
    pos++;
    dz = strtod(argv[pos], &endptr);
    RAS(argv[pos] != endptr, "parse dz");
    if (ref_mpi_once(ref_mpi)) printf("--shift %e %e %e\n", dx, dy, dz);
    each_ref_node_valid_node(ref_node, node) {
      ref_node_xyz(ref_node, 0, node) += dx;
      ref_node_xyz(ref_node, 1, node) += dy;
      ref_node_xyz(ref_node, 2, node) += dz;
    }
  }

  RXS(ref_args_find(argc, argv, "--rotatey", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos) {
    char *endptr;
    REF_DBL degree, rad;
    REF_NODE ref_node = ref_grid_node(ref_grid);
    REF_INT node;
    if (pos + 1 >= argc) {
      if (ref_mpi_once(ref_mpi)) printf("--rotatey missing degrees\n");
      goto shutdown;
    }
    pos++;
    degree = strtod(argv[pos], &endptr);
    RAS(argv[pos] != endptr, "parse degree");
    rad = ref_math_in_radians(degree);
    if (ref_mpi_once(ref_mpi))
      printf("--rotatex %f degree %f radian\n", degree, rad);
    each_ref_node_valid_node(ref_node, node) {
      REF_DBL x, y, z;
      x = ref_node_xyz(ref_node, 0, node);
      y = ref_node_xyz(ref_node, 1, node);
      z = ref_node_xyz(ref_node, 2, node);
      ref_node_xyz(ref_node, 0, node) = x * cos(rad) - z * sin(rad);
      ref_node_xyz(ref_node, 1, node) = y;
      ref_node_xyz(ref_node, 2, node) = x * sin(rad) + z * cos(rad);
    }
  }

  RXS(ref_args_find(argc, argv, "--surface", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos) {
    REF_INT group;
    REF_CELL ref_cell;
    if (ref_mpi_once(ref_mpi)) printf("  --surface deleting 3D cells\n");
    surface_only = REF_TRUE;
    each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
      RSS(ref_cell_free(ref_cell), "free cell");
      RSS(ref_cell_create(&ref_grid_cell(ref_grid, group),
                          (REF_CELL_TYPE)group),
          "empty cell create");
      ref_cell = ref_grid_cell(ref_grid, group);
    }
  }

  RXS(ref_args_find(argc, argv, "--orient", &pos), REF_NOT_FOUND, "arg search");
  if (REF_EMPTY != pos) {
    if (ref_mpi_once(ref_mpi)) printf("  --orient twod in place\n");
    RSS(ref_grid_orient_twod(ref_grid), "orient twod");
  }

  RXS(ref_args_find(argc, argv, "--shard", &pos), REF_NOT_FOUND, "arg search");
  if (REF_EMPTY != pos) {
    if (ref_mpi_once(ref_mpi)) printf("  --shard in place\n");
    RSS(ref_shard_in_place(ref_grid), "shard to simplex");
  }

  RXS(ref_args_find(argc, argv, "--blockhead", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos) {
    if (ref_mpi_once(ref_mpi)) printf("  --blockhead in place\n");
    RSS(ref_subdiv_to_hex(ref_grid), "shard to simplex");
  }

  RXS(ref_args_find(argc, argv, "--enrich2", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos) {
    if (ref_mpi_once(ref_mpi)) printf("  --enrich2\n");
    RSS(ref_geom_enrich2(ref_grid), "enrich to q2");
  }

  RXS(ref_args_find(argc, argv, "--extrude", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos) {
    extrude = REF_TRUE;
  }

  RXS(ref_args_find(argc, argv, "--planes", &pos), REF_NOT_FOUND, "arg search");
  if (REF_EMPTY != pos && extrude) {
    if (ref_mpi_once(ref_mpi)) printf("--extrude and --planes exclusive\n");
    goto shutdown;
  }
  if (REF_EMPTY != pos) {
    REF_GRID twod_grid = ref_grid;
    REF_INT n_planes;
    if (pos + 1 >= argc) {
      if (ref_mpi_once(ref_mpi)) printf("--planes missing N\n");
      goto shutdown;
    }
    n_planes = atoi(argv[pos + 1]);
    if (n_planes < 2) {
      if (ref_mpi_once(ref_mpi))
        printf("--planes %d must be 2 or more\n", n_planes);
      goto shutdown;
    }
    if (ref_mpi_once(ref_mpi))
      printf("extrude %d layers of prisms\n", n_planes);
    RSS(ref_grid_extrude_twod(&ref_grid, twod_grid, n_planes), "extrude");
    RSS(ref_grid_free(twod_grid), "free");
  } else {
    end_of_string = strlen(out_file);
    if (ref_grid_twod(ref_grid) && (end_of_string >= 6) &&
        (strncmp(&out_file[end_of_string - 6], ".ugrid", 6)) == 0) {
      extrude = REF_TRUE;
      if (ref_mpi_once(ref_mpi))
        printf("  --extrude implicitly added to ugrid output of 2D input.\n");
    }
  }

  if (extrude) {
    REF_GRID twod_grid = ref_grid;
    if (ref_mpi_once(ref_mpi)) printf("extrude prisms\n");
    RSS(ref_grid_extrude_twod(&ref_grid, twod_grid, 2), "extrude");
    RSS(ref_grid_free(twod_grid), "free");
  }

  RXS(ref_args_find(argc, argv, "--zero-y-face", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos) {
    REF_DBL deviation, total_deviation;
    REF_CELL ref_cell;
    REF_NODE ref_node = ref_grid_node(ref_grid);
    REF_INT faceid, group, cell, node, nodes[REF_CELL_MAX_SIZE_PER];
    if (pos + 1 >= argc) {
      if (ref_mpi_once(ref_mpi)) printf("--zero-y-face missing faceid\n");
      goto shutdown;
    }
    faceid = atoi(argv[pos + 1]);
    if (ref_mpi_once(ref_mpi)) printf("zero y of face %d\n", faceid);
    deviation = 0.0;
    each_ref_grid_2d_ref_cell(ref_grid, group, ref_cell) {
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        if (faceid == nodes[ref_cell_node_per(ref_cell)]) {
          each_ref_cell_cell_node(ref_cell, node) {
            deviation =
                MAX(deviation, ABS(ref_node_xyz(ref_node, 1, nodes[node])));
            ref_node_xyz(ref_node, 1, nodes[node]) = 0.0;
          }
        }
      }
    }
    RSS(ref_mpi_max(ref_mpi, &deviation, &total_deviation, REF_DBL_TYPE),
        "mpi max");
    if (ref_mpi_once(ref_mpi)) printf("max deviation %e\n", deviation);
  }

  RXS(ref_args_find(argc, argv, "--axi", &pos), REF_NOT_FOUND, "arg search");
  if (REF_EMPTY != pos) {
    if (ref_mpi_once(ref_mpi)) printf("--axi creates wedge about y=z=0 axis\n");
    RSS(ref_axi_wedge(ref_grid), "wedge");
  }

  if (ref_mpi_para(ref_mpi)) {
    if (surface_only) {
      if (ref_mpi_once(ref_mpi)) printf("gather surface to %s\n", out_file);
    } else {
      if (ref_mpi_once(ref_mpi))
        printf("gather " REF_GLOB_FMT " nodes to %s\n",
               ref_node_n_global(ref_grid_node(ref_grid)), out_file);
    }
    RSS(ref_gather_by_extension(ref_grid, out_file), "gather");
    ref_mpi_stopwatch_stop(ref_mpi, "gather");
  } else {
    if (surface_only) {
      if (ref_mpi_once(ref_mpi)) printf("export surface to %s\n", out_file);
    } else {
      if (ref_mpi_once(ref_mpi))
        printf("export " REF_GLOB_FMT " nodes to %s\n",
               ref_node_n_global(ref_grid_node(ref_grid)), out_file);
    }
    RSS(ref_export_by_extension(ref_grid, out_file), "export");
    ref_mpi_stopwatch_stop(ref_mpi, "export");
  }

  RSS(ref_grid_free(ref_grid), "free grid");

  return REF_SUCCESS;
shutdown:
  if (ref_mpi_once(ref_mpi)) translate_help(argv[0]);
  return REF_FAILURE;
}